

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

shared_ptr<cxxopts::Value> cxxopts::value<bool>(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cxxopts::Value> sVar1;
  shared_ptr<cxxopts::values::standard_value<bool>_> local_20;
  
  std::make_shared<cxxopts::values::standard_value<bool>>();
  std::shared_ptr<cxxopts::Value>::shared_ptr<cxxopts::values::standard_value<bool>,void>
            ((shared_ptr<cxxopts::Value> *)in_RDI,&local_20);
  std::shared_ptr<cxxopts::values::standard_value<bool>_>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
value()
{
  return std::make_shared<values::standard_value<T>>();
}